

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_lax_polygon_layer.cc
# Opt level: O2

void __thiscall
s2builderutil::LaxPolygonLayer::BuildDirected(LaxPolygonLayer *this,Graph *g,S2Error *error)

{
  DegenerateBoundaries DVar1;
  pointer ppVar2;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices;
  IdSetLexicon *input_edge_id_set_lexicon;
  vector<int,_std::allocator<int>_> *label_set_ids;
  IdSetLexicon *label_set_lexicon;
  IsFullPolygonPredicate is_full_polygon_predicate;
  pointer pPVar3;
  bool bVar4;
  pointer pPVar5;
  uint *puVar6;
  Graph *this_00;
  int e;
  ulong uVar7;
  long lVar8;
  undefined8 uVar9;
  _Manager_type in_stack_fffffffffffffe98;
  S2Error *error_00;
  _Vector_base<int,_std::allocator<int>_> local_158;
  _Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_138;
  vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
  degeneracies;
  vector<int,_std::allocator<int>_> edges_to_discard;
  vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  loops;
  undefined1 local_b8 [8];
  pointer pPStack_b0;
  pointer local_a8;
  _Function_base local_70;
  function<bool_(const_S2Builder::Graph_&,_S2Error_*)> local_50;
  
  local_138._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  loops.
  super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  loops.
  super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  loops.
  super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  DVar1 = (this->options_).degenerate_boundaries_;
  if (DVar1 == KEEP) {
    bVar4 = IsFullyDegenerate(g);
    if (bVar4) {
LAB_002144d6:
      MaybeAddFullLoop(g,&loops,error);
    }
  }
  else if (DVar1 == DISCARD) {
    if ((int)((ulong)((long)(g->edges_->
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(g->edges_->
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 3) == 0)
    goto LAB_002144d6;
  }
  else {
    error_00 = error;
    FindPolygonDegeneracies(&degeneracies,g,error);
    if (error->code_ != OK) {
      std::
      _Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
      ::~_Vector_base(&degeneracies.
                       super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                     );
      goto LAB_00214897;
    }
    error = error_00;
    if ((long)degeneracies.
              super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)degeneracies.
              super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
              ._M_impl.super__Vector_impl_data._M_start >> 2 ==
        (long)(int)((ulong)((long)(g->edges_->
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(g->edges_->
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 3)) {
      if (degeneracies.
          super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          degeneracies.
          super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        MaybeAddFullLoop(g,&loops,error_00);
        error = error_00;
      }
      else if ((int)*degeneracies.
                     super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                     ._M_impl.super__Vector_impl_data._M_start < 0) {
        local_b8 = (undefined1  [8])0x0;
        pPStack_b0 = (pointer)0x0;
        local_a8 = (pointer)0x0;
        std::
        vector<std::vector<Vector3<double>,std::allocator<Vector3<double>>>,std::allocator<std::vector<Vector3<double>,std::allocator<Vector3<double>>>>>
        ::emplace_back<std::vector<Vector3<double>,std::allocator<Vector3<double>>>>
                  ((vector<std::vector<Vector3<double>,std::allocator<Vector3<double>>>,std::allocator<std::vector<Vector3<double>,std::allocator<Vector3<double>>>>>
                    *)&loops,(vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_b8)
        ;
        std::_Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>::~_Vector_base
                  ((_Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_b8);
        error = error_00;
      }
    }
    pPVar3 = degeneracies.
             super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    for (pPVar5 = degeneracies.
                  super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                  ._M_impl.super__Vector_impl_data._M_start; pPVar5 != pPVar3; pPVar5 = pPVar5 + 1)
    {
      if ((DVar1 != DISCARD_HOLES) != (int)*pPVar5 < 0) {
        local_b8 = (undefined1  [8])(CONCAT44(local_b8._4_4_,*pPVar5) & 0xffffffff7fffffff);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&edges_to_discard,(int *)local_b8)
        ;
      }
    }
    if (edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::
      __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ();
      bVar4 = std::
              is_sorted<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                        ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                         edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                         edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      if (!bVar4) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)local_b8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_lax_polygon_layer.cc"
                   ,0x76,kFatal,(ostream *)&std::cerr);
        std::operator<<((ostream *)pPStack_b0,
                        "Check failed: std::is_sorted(edges_to_discard.begin(), edges_to_discard.end()) "
                       );
        abort();
      }
      if (local_138._M_impl.super__Vector_impl_data._M_finish !=
          local_138._M_impl.super__Vector_impl_data._M_start) {
        local_138._M_impl.super__Vector_impl_data._M_finish =
             local_138._M_impl.super__Vector_impl_data._M_start;
      }
      if (local_158._M_impl.super__Vector_impl_data._M_finish !=
          local_158._M_impl.super__Vector_impl_data._M_start) {
        local_158._M_impl.super__Vector_impl_data._M_finish =
             local_158._M_impl.super__Vector_impl_data._M_start;
      }
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::reserve
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_138,
                 (long)(int)((ulong)((long)(g->edges_->
                                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(g->edges_->
                                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start) >> 3));
      std::vector<int,_std::allocator<int>_>::reserve
                ((vector<int,_std::allocator<int>_> *)&local_158,
                 (long)(int)((ulong)((long)(g->edges_->
                                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(g->edges_->
                                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start) >> 3));
      lVar8 = 0;
      puVar6 = (uint *)edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
      for (uVar7 = 0;
          ppVar2 = (g->edges_->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_start,
          (long)uVar7 <
          (long)(int)((ulong)((long)(g->edges_->
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2) >> 3
                     ); uVar7 = uVar7 + 1) {
        if ((puVar6 == (uint *)edges_to_discard.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish) || (uVar7 != *puVar6)) {
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     &local_138,(value_type *)((long)&ppVar2->first + lVar8));
          local_b8._0_4_ =
               (g->input_edge_id_set_ids_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar7];
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)&local_158,(int *)local_b8);
        }
        else {
          puVar6 = puVar6 + 1;
        }
        lVar8 = lVar8 + 8;
      }
      if (puVar6 != (uint *)edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)local_b8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_lax_polygon_layer.cc"
                   ,0x84,kFatal,(ostream *)&std::cerr);
        std::operator<<((ostream *)pPStack_b0,"Check failed: it == edges_to_discard.end() ");
        abort();
      }
      vertices = g->vertices_;
      input_edge_id_set_lexicon = g->input_edge_id_set_lexicon_;
      label_set_ids = g->label_set_ids_;
      label_set_lexicon = g->label_set_lexicon_;
      uVar9 = 0x21471c;
      std::function<bool_(const_S2Builder::Graph_&,_S2Error_*)>::function
                (&local_50,&g->is_full_polygon_predicate_);
      is_full_polygon_predicate.super__Function_base._M_functor._8_8_ = uVar9;
      is_full_polygon_predicate.super__Function_base._M_functor._M_unused._M_object = &local_50;
      is_full_polygon_predicate.super__Function_base._M_manager = in_stack_fffffffffffffe98;
      is_full_polygon_predicate._M_invoker = (_Invoker_type)error;
      S2Builder::Graph::Graph
                ((Graph *)local_b8,&g->options_,vertices,
                 (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_138,
                 (vector<int,_std::allocator<int>_> *)&local_158,input_edge_id_set_lexicon,
                 label_set_ids,label_set_lexicon,is_full_polygon_predicate);
      S2Builder::Graph::operator=(g,(Graph *)local_b8);
      std::_Function_base::~_Function_base(&local_70);
      std::_Function_base::~_Function_base(&local_50.super__Function_base);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&edges_to_discard.super__Vector_base<int,_std::allocator<int>_>);
    std::
    _Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
    ::~_Vector_base(&degeneracies.
                     super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                   );
  }
  local_b8 = (undefined1  [8])0x0;
  pPStack_b0 = (pointer)0x0;
  local_a8 = (pointer)0x0;
  this_00 = g;
  bVar4 = S2Builder::Graph::GetDirectedLoops
                    (g,CIRCUIT,
                     (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)local_b8,error);
  if (bVar4) {
    AppendPolygonLoops((LaxPolygonLayer *)this_00,g,
                       (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)local_b8,&loops);
    AppendEdgeLabels(this,g,(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_b8);
    degeneracies.
    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b8;
    degeneracies.
    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
    ._M_impl.super__Vector_impl_data._M_finish = pPStack_b0;
    degeneracies.
    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_a8;
    local_b8 = (undefined1  [8])0x0;
    pPStack_b0 = (pointer)0x0;
    local_a8 = (pointer)0x0;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&degeneracies);
    degeneracies.
    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_138._M_impl.super__Vector_impl_data._M_start;
    degeneracies.
    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_138._M_impl.super__Vector_impl_data._M_finish;
    degeneracies.
    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_138._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_138._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               &degeneracies);
    degeneracies.
    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_158._M_impl.super__Vector_impl_data._M_start;
    degeneracies.
    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_158._M_impl.super__Vector_impl_data._M_finish;
    degeneracies.
    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_158._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&degeneracies);
    S2LaxPolygonShape::Init(this->polygon_,&loops);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_b8);
LAB_00214897:
  std::
  vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  ::~vector(&loops);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_158);
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&local_138);
  return;
}

Assistant:

void LaxPolygonLayer::BuildDirected(Graph g, S2Error* error) {
  // Some cases are implemented by constructing a new graph with certain
  // degenerate edges removed (overwriting "g").  "new_edges" is where the
  // edges for the new graph are stored.
  vector<Edge> new_edges;
  vector<InputEdgeIdSetId> new_input_edge_id_set_ids;
  vector<vector<S2Point>> loops;
  auto degenerate_boundaries = options_.degenerate_boundaries();
  if (degenerate_boundaries == DegenerateBoundaries::DISCARD) {
    // This is the easiest case, since there are no degeneracies.
    if (g.num_edges() == 0) MaybeAddFullLoop(g, &loops, error);
  } else if (degenerate_boundaries == DegenerateBoundaries::KEEP) {
    // S2LaxPolygonShape doesn't need to distinguish degenerate shells from
    // holes except when the entire graph is degenerate, in which case we need
    // to decide whether it represents an empty polygons possibly with
    // degenerate shells, or a full polygon possibly with degenerate holes.
    if (s2builderutil::IsFullyDegenerate(g)) {
      MaybeAddFullLoop(g, &loops, error);
    }
  } else {
    // For DISCARD_SHELLS and DISCARD_HOLES we first determine whether any
    // degenerate loops of the given type exist, and if so we construct a new
    // graph with those edges removed (overwriting "g").
    bool discard_holes =
        (degenerate_boundaries == DegenerateBoundaries::DISCARD_HOLES);
    auto degeneracies = s2builderutil::FindPolygonDegeneracies(g, error);
    if (!error->ok()) return;
    if (degeneracies.size() == g.num_edges()) {
      if (degeneracies.empty()) {
        MaybeAddFullLoop(g, &loops, error);
      } else if (degeneracies[0].is_hole) {
        loops.push_back({});  // Full loop.
      }
    }
    vector<EdgeId> edges_to_discard;
    for (auto degeneracy : degeneracies) {
      if (degeneracy.is_hole == discard_holes) {
        edges_to_discard.push_back(degeneracy.edge_id);
      }
    }
    if (!edges_to_discard.empty()) {
      // Construct a new graph that discards the unwanted edges.
      std::sort(edges_to_discard.begin(), edges_to_discard.end());
      DiscardEdges(g, edges_to_discard, &new_edges, &new_input_edge_id_set_ids);
      g = Graph(g.options(), &g.vertices(),
                &new_edges, &new_input_edge_id_set_ids,
                &g.input_edge_id_set_lexicon(), &g.label_set_ids(),
                &g.label_set_lexicon(), g.is_full_polygon_predicate());
    }
  }
  vector<Graph::EdgeLoop> edge_loops;
  if (!g.GetDirectedLoops(LoopType::CIRCUIT, &edge_loops, error)) {
    return;
  }
  AppendPolygonLoops(g, edge_loops, &loops);
  AppendEdgeLabels(g, edge_loops);
  vector<Graph::EdgeLoop>().swap(edge_loops);  // Release memory
  vector<Edge>().swap(new_edges);
  vector<InputEdgeIdSetId>().swap(new_input_edge_id_set_ids);
  polygon_->Init(loops);
}